

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall kj::pumpWebSocketLoop(kj *this,WebSocket *from,WebSocket *to)

{
  Coroutine<void> *this_00;
  PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
  *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  PromiseAwaiter<void> *__return_storage_ptr___01;
  PromiseAwaiter<void> *__return_storage_ptr___02;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *__return_storage_ptr___03;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *promise;
  Promise<void> *promise_00;
  Promise<void> *promise_01;
  Promise<void> *promise_02;
  uint uVar1;
  PromiseArenaMember *pPVar2;
  long lVar3;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> coroutine;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  coroutine._M_fr_ptr = operator_new(0xb38);
  *(code **)coroutine._M_fr_ptr = pumpWebSocketLoop;
  *(code **)((long)coroutine._M_fr_ptr + 8) = pumpWebSocketLoop;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(WebSocket **)((long)coroutine._M_fr_ptr + 0xb28) = to;
  *(WebSocket **)((long)coroutine._M_fr_ptr + 0xb20) = from;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  location.function = "pumpWebSocketLoop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xeb5;
  location.columnNumber = 0x1a;
  _::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
       ((long)coroutine._M_fr_ptr + 0x238);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x418);
  __return_storage_ptr___01 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x5d0);
  __return_storage_ptr___02 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x788);
  __return_storage_ptr___03 =
       (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
       ((long)coroutine._M_fr_ptr + 0xad8);
  promise = (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
            ((long)coroutine._M_fr_ptr + 0xb00);
  promise_00 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0xb08);
  promise_01 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0xb10);
  promise_02 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0xb18);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  *(Coroutine<void> **)this = this_00;
  do {
    (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0xb20) + 0x30))
              (promise,*(long **)((long)coroutine._M_fr_ptr + 0xb20),0x100000);
    co_await<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
              (__return_storage_ptr__,promise);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0xb30) = 0;
    bVar4 = _::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar4) {
      return (PromiseBase)(PromiseBase)this;
    }
    _::PromiseAwaiter<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    await_resume(__return_storage_ptr___03,__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 1000) == '\x01') {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
                ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)
                 ((long)coroutine._M_fr_ptr + 0x3f0));
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    _::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    pPVar2 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      _::PromiseDisposer::dispose(pPVar2);
    }
    uVar1 = __return_storage_ptr___03->tag;
    iVar8 = 0;
    iVar9 = iVar8;
    if (uVar1 == 1) {
      lVar3 = *(long *)((long)coroutine._M_fr_ptr + 0xae8);
      lVar7 = lVar3;
      if (lVar3 != 0) {
        lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0xae0);
      }
      lVar6 = 0;
      if (lVar3 != 0) {
        lVar6 = lVar3 + -1;
      }
      (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0xb28) + 8))
                (promise_00,*(long **)((long)coroutine._M_fr_ptr + 0xb28),lVar7,lVar6);
      co_await<void>(__return_storage_ptr___00,promise_00);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0xb30) = 1;
      bVar4 = _::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
      if (bVar4) {
        return (PromiseBase)(PromiseBase)this;
      }
      _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x430) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x438));
      }
      _::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___00);
      pPVar2 = &((promise_00->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (pPVar2 != (PromiseArenaMember *)0x0) {
        (promise_00->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        _::PromiseDisposer::dispose(pPVar2);
      }
    }
    else {
      iVar9 = 0;
      if (uVar1 == 2) {
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb28))
                  (promise_01,*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb28),
                   *(undefined8 *)((long)coroutine._M_fr_ptr + 0xae0),
                   *(undefined8 *)((long)coroutine._M_fr_ptr + 0xae8));
        co_await<void>(__return_storage_ptr___01,promise_01);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xb30) = 2;
        bVar4 = _::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)__return_storage_ptr___01,(CoroutineBase *)this_00)
        ;
        if (bVar4) {
          return (PromiseBase)(PromiseBase)this;
        }
        _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___01);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x5e8) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x5f0));
        }
        _::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___01);
        pPVar2 = &((promise_01->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar2 != (PromiseArenaMember *)0x0) {
          (promise_01->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          _::PromiseDisposer::dispose(pPVar2);
          iVar9 = iVar8;
        }
      }
      else if (uVar1 == 3) {
        lVar3 = *(long *)((long)coroutine._M_fr_ptr + 0xaf0);
        pcVar5 = "";
        if (lVar3 != 0) {
          pcVar5 = *(char **)((long)coroutine._M_fr_ptr + 0xae8);
        }
        (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0xb28) + 0x10))
                  (promise_02,*(long **)((long)coroutine._M_fr_ptr + 0xb28),
                   *(undefined2 *)((long)coroutine._M_fr_ptr + 0xae0),pcVar5,
                   lVar3 + (ulong)(lVar3 == 0));
        co_await<void>(__return_storage_ptr___02,promise_02);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xb30) = 3;
        bVar4 = _::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)__return_storage_ptr___02,(CoroutineBase *)this_00)
        ;
        if (bVar4) {
          return (PromiseBase)(PromiseBase)this;
        }
        _::PromiseAwaiter<void>::await_resume(__return_storage_ptr___02);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x7a0) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x7a8));
        }
        _::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___02);
        pPVar2 = &((promise_02->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar2 != (PromiseArenaMember *)0x0) {
          (promise_02->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          _::PromiseDisposer::dispose(pPVar2);
        }
        _::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0xb31));
        iVar9 = 3;
      }
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
              (__return_storage_ptr___03);
    if (iVar9 != 0) {
      if (iVar9 == 3) {
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xb30) = 4;
      }
      else {
        if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true)
        {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
        }
        _::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
        operator_delete(coroutine._M_fr_ptr,0xb38);
      }
      return (PromiseBase)(PromiseBase)this;
    }
  } while( true );
}

Assistant:

static kj::Promise<void> pumpWebSocketLoop(WebSocket& from, WebSocket& to) {
  try {
    while (true) {
      auto message = co_await from.receive();
      KJ_SWITCH_ONEOF(message) {
        KJ_CASE_ONEOF(text, kj::String) {
          co_await to.send(text);
        }
        KJ_CASE_ONEOF(data, kj::Array<byte>) {
          co_await to.send(data);
        }
        KJ_CASE_ONEOF(close, WebSocket::Close) {
          // Once a close has passed through, the pump is complete.
          co_await to.close(close.code, close.reason);
          co_return;
        }
      }
      // continue the loop
    }
  } catch (...) {
    // We don't know if it was a read or a write that threw. If it was a read that threw, we need
    // to send a disconnect on the destination. If it was the destination that threw, it
    // shouldn't hurt to disconnect() it again, but we'll catch and squelch any exceptions.
    kj::runCatchingExceptions([&to]() { to.disconnect(); });

    // In any case, this error broke the pump. We should propagate it out as the pump result.
    throw;
  }
}